

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O2

REF_STATUS ref_mpi_deep_copy(REF_MPI *ref_mpi_ptr,REF_MPI original)

{
  REF_DBL RVar1;
  REF_INT RVar2;
  REF_BOOL RVar3;
  REF_INT RVar4;
  REF_STATUS RVar5;
  REF_MPI pRVar6;
  
  pRVar6 = (REF_MPI)malloc(0x38);
  *ref_mpi_ptr = pRVar6;
  if (pRVar6 == (REF_MPI)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0xc2,
           "ref_mpi_deep_copy","malloc *ref_mpi_ptr of REF_MPI_STRUCT NULL");
    RVar5 = 2;
  }
  else {
    RVar2 = original->id;
    pRVar6->n = original->n;
    pRVar6->id = RVar2;
    pRVar6->max_tag = original->max_tag;
    pRVar6->comm = (void *)0x0;
    RVar1 = original->first_time;
    pRVar6->start_time = original->start_time;
    pRVar6->first_time = RVar1;
    RVar3 = original->debug;
    RVar2 = original->timing;
    RVar4 = original->reduce_byte_limit;
    pRVar6->native_alltoallv = original->native_alltoallv;
    pRVar6->debug = RVar3;
    pRVar6->timing = RVar2;
    pRVar6->reduce_byte_limit = RVar4;
    RVar5 = 0;
  }
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_deep_copy(REF_MPI *ref_mpi_ptr, REF_MPI original) {
  REF_MPI ref_mpi;

  ref_malloc(*ref_mpi_ptr, 1, REF_MPI_STRUCT);
  ref_mpi = (*ref_mpi_ptr);

  ref_mpi->id = original->id;
  ref_mpi->n = original->n;
  ref_mpi->max_tag = original->max_tag;

  ref_mpi->comm = NULL;
#ifdef HAVE_MPI
  if (NULL != original->comm) {
    ref_malloc(ref_mpi->comm, 1, MPI_Comm);
    RNS(memcpy(ref_mpi->comm, original->comm, sizeof(MPI_Comm)), "copy comm");
  }
#endif

  ref_mpi->first_time = original->first_time;
  ref_mpi->start_time = original->start_time;

  ref_mpi->native_alltoallv = original->native_alltoallv;
  ref_mpi->debug = original->debug;
  ref_mpi->timing = original->timing;
  ref_mpi->reduce_byte_limit = original->reduce_byte_limit;

  return REF_SUCCESS;
}